

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void anon_unknown.dwarf_1092::sp
               (Array2D<Imf_3_2::Rgba> *px,int w,int h,float xc,float yc,float rc,float rd,float gn,
               float bl,float lm)

{
  Rgba *pRVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  long lVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar10 = floorf(yc - rc);
  fVar14 = 0.0;
  if (0.0 <= fVar10) {
    fVar14 = fVar10;
  }
  fVar11 = ceilf(yc + rc);
  fVar10 = (float)h + -1.0;
  if (fVar11 <= (float)h + -1.0) {
    fVar10 = fVar11;
  }
  if ((int)fVar14 <= (int)fVar10) {
    fVar12 = ceilf(xc + rc);
    fVar11 = (float)w + -1.0;
    if (fVar12 <= (float)w + -1.0) {
      fVar11 = fVar12;
    }
    fVar13 = floorf(xc - rc);
    fVar12 = 0.0;
    if (0.0 <= fVar13) {
      fVar12 = fVar13;
    }
    lVar8 = (long)(int)fVar14;
    do {
      if ((int)fVar12 <= (int)fVar11) {
        fVar14 = ((float)(int)lVar8 - yc) / rc;
        lVar6 = (long)(int)fVar12;
        do {
          fVar13 = ((float)(int)lVar6 - xc) / rc;
          fVar15 = fVar13 * fVar13 + fVar14 * fVar14;
          if (fVar15 < 0.0) {
            fVar15 = sqrtf(fVar15);
          }
          else {
            fVar15 = SQRT(fVar15);
          }
          if (fVar15 < 1.0) {
            fVar16 = 1.0 - fVar15 * fVar15;
            if (fVar16 < 0.0) {
              fVar16 = sqrtf(fVar16);
            }
            else {
              fVar16 = SQRT(fVar16);
            }
            lVar3 = _imath_half_to_float_table;
            fVar13 = fVar16 * 0.7071 + fVar13 * 0.42426 + fVar14 * -0.56568;
            fVar17 = (float)(-(uint)(fVar13 < 0.0) & (uint)(fVar13 * -0.1) |
                            ~-(uint)(fVar13 < 0.0) & (uint)fVar13);
            uVar4 = 0x32;
            fVar16 = 1.0;
            fVar13 = fVar17;
            do {
              if ((uVar4 & 1) != 0) {
                fVar16 = fVar16 * fVar13;
              }
              fVar13 = fVar13 * fVar13;
              uVar9 = (uint)uVar4;
              uVar4 = uVar4 >> 1;
            } while (1 < uVar9);
            uVar9 = -(uint)(rc + -1.0 < fVar15 * rc);
            fVar13 = (float)(~uVar9 & 0x3f800000 | (uint)(rc - fVar15 * rc) & uVar9);
            fVar17 = fVar17 + fVar16 * 4.0;
            lVar5 = px->_sizeY * lVar8;
            pRVar1 = px->_data;
            fVar16 = 1.0 - fVar13;
            fVar18 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar5 + lVar6].r._h * 4)
                     * fVar16 + fVar17 * rd * lm * fVar13;
            fVar15 = ABS(fVar18);
            uVar7 = (ushort)((uint)fVar18 >> 0x10) & 0x8000;
            if ((uint)fVar15 < 0x38800000) {
              if ((0x33000000 < (uint)fVar15) &&
                 (uVar9 = (uint)fVar15 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar15 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar15 < 0x7f800000) {
              if ((uint)fVar15 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar15 + 0x8000fff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar15 != INFINITY) {
                uVar9 = (uint)fVar15 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].r._h = uVar7;
            fVar18 = *(float *)(lVar3 + (ulong)pRVar1[lVar5 + lVar6].g._h * 4) * fVar16 +
                     fVar17 * gn * lm * fVar13;
            fVar15 = ABS(fVar18);
            uVar7 = (ushort)((uint)fVar18 >> 0x10) & 0x8000;
            if ((uint)fVar15 < 0x38800000) {
              if ((0x33000000 < (uint)fVar15) &&
                 (uVar9 = (uint)fVar15 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar15 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar15 < 0x7f800000) {
              if ((uint)fVar15 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar15 + 0x8000fff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar15 != INFINITY) {
                uVar9 = (uint)fVar15 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].g._h = uVar7;
            fVar15 = *(float *)(lVar3 + (ulong)pRVar1[lVar5 + lVar6].b._h * 4) * fVar16 +
                     fVar13 * fVar17 * bl * lm;
            fVar13 = ABS(fVar15);
            uVar7 = (ushort)((uint)fVar15 >> 0x10) & 0x8000;
            if ((uint)fVar13 < 0x38800000) {
              if ((0x33000000 < (uint)fVar13) &&
                 (uVar9 = (uint)fVar13 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar13 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar13 < 0x7f800000) {
              if ((uint)fVar13 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar13 != INFINITY) {
                uVar9 = (uint)fVar13 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].b._h = uVar7;
            fVar15 = 1.0 - (1.0 - *(float *)(lVar3 + (ulong)pRVar1[lVar5 + lVar6].a._h * 4)) *
                           fVar16;
            fVar13 = ABS(fVar15);
            uVar7 = (ushort)((uint)fVar15 >> 0x10) & 0x8000;
            if ((uint)fVar13 < 0x38800000) {
              if ((0x33000000 < (uint)fVar13) &&
                 (uVar9 = (uint)fVar13 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar13 >> 0x17),
                 uVar7 = uVar7 | (ushort)(uVar9 >> (0x7eU - cVar2 & 0x1f)),
                 0x80000000 < uVar9 << (cVar2 + 0xa2U & 0x1f))) {
                uVar7 = uVar7 + 1;
              }
            }
            else if ((uint)fVar13 < 0x7f800000) {
              if ((uint)fVar13 < 0x477ff000) {
                uVar7 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >>
                                0xd) | uVar7;
              }
              else {
                uVar7 = uVar7 | 0x7c00;
              }
            }
            else {
              uVar7 = uVar7 | 0x7c00;
              if (fVar13 != INFINITY) {
                uVar9 = (uint)fVar13 >> 0xd & 0x3ff;
                uVar7 = uVar7 | (ushort)uVar9 | (ushort)(uVar9 == 0);
              }
            }
            pRVar1[lVar5 + lVar6].a._h = uVar7;
          }
          lVar6 = lVar6 + 1;
        } while ((int)fVar11 + 1 != (int)lVar6);
      }
      lVar8 = lVar8 + 1;
    } while ((int)fVar10 + 1 != (int)lVar8);
  }
  return;
}

Assistant:

void
sp (Array2D<Rgba>& px,
    int            w,
    int            h,
    float          xc,
    float          yc,
    float          rc,
    float          rd,
    float          gn,
    float          bl,
    float          lm)
{
    int x1 = int (max ((float) floor (xc - rc), 0.0f));
    int x2 = int (min ((float) ceil (xc + rc), w - 1.0f));
    int y1 = int (max ((float) floor (yc - rc), 0.0f));
    int y2 = int (min ((float) ceil (yc + rc), h - 1.0f));

    for (int y = y1; y <= y2; ++y)
    {
        for (int x = x1; x <= x2; ++x)
        {
            float xl = (x - xc) / rc;
            float yl = (y - yc) / rc;
            float r  = sqrt (xl * xl + yl * yl);

            if (r >= 1) continue;

            float a = 1;

            if (r * rc > rc - 1) a = rc - r * rc;

            float zl = sqrt (1 - r * r);
            float dl = xl * 0.42426 - yl * 0.56568 + zl * 0.70710;

            if (dl < 0) dl *= -0.1;

            float hl = pw (dl, 50) * 4;
            float dr = (dl + hl) * rd;
            float dg = (dl + hl) * gn;
            float db = (dl + hl) * bl;

            Rgba& p = px[y][x];
            p.r     = p.r * (1 - a) + dr * lm * a;
            p.g     = p.g * (1 - a) + dg * lm * a;
            p.b     = p.b * (1 - a) + db * lm * a;
            p.a     = 1 - (1 - p.a) * (1 - a);
        }
    }
}